

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.hpp
# Opt level: O1

void __thiscall Centaurus::ChaserEM64T<char>::~ChaserEM64T(ChaserEM64T<char> *this)

{
  ~ChaserEM64T(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~ChaserEM64T() {}